

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

qpdf_oh qpdf_oh_new_integer(qpdf_data qpdf,longlong value)

{
  qpdf_oh qVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffe8;
  
  QPDFObjectHandle::newInteger((longlong)in_stack_ffffffffffffffe8._M_pi);
  qVar1 = new_object(qpdf,(QPDFObjectHandle *)&stack0xffffffffffffffe0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  return qVar1;
}

Assistant:

qpdf_oh
qpdf_oh_new_integer(qpdf_data qpdf, long long value)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_oh_new_integer");
    return new_object(qpdf, QPDFObjectHandle::newInteger(value));
}